

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::VisitDescriptorsTest_AllTypesDeduceSelective_Test::TestBody
          (VisitDescriptorsTest_AllTypesDeduceSelective_Test *this)

{
  bool bVar1;
  Descriptor *this_00;
  char *pcVar2;
  undefined1 *puVar3;
  char *extraout_RDX;
  initializer_list<const_char_*> xs;
  basic_string_view<char,_std::char_traits<char>_> matcher_00;
  ContainsMatcher<std::basic_string_view<char,_std::char_traits<char>_>_> m;
  NotMatcher<testing::internal::ContainsMatcher<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  matcher_01;
  AssertHelper local_158;
  Message local_150;
  char *local_148;
  char *pcStack_140;
  char *local_138;
  char *pcStack_130;
  char *local_128;
  char *pcStack_120;
  char *local_118;
  testing *local_108;
  undefined8 local_100;
  UnorderedElementsAreArrayMatcher<const_char_*> local_f8;
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<const_char_*>_>
  local_d8;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_1;
  Message local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  undefined1 local_30 [8];
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  descriptors;
  FileDescriptor *file;
  VisitDescriptorsTest_AllTypesDeduceSelective_Test *this_local;
  UnorderedElementsAreArrayMatcher<const_char_*> *matcher;
  
  this_00 = proto2_unittest::TestAllTypes::GetDescriptor();
  descriptors.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)Descriptor::file(this_00);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)local_30);
  internal::
  VisitDescriptors<google::protobuf::(anonymous_namespace)::VisitDescriptorsTest_AllTypesDeduceSelective_Test::TestBody()::__0>
            ((FileDescriptor *)
             descriptors.
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)local_30);
  local_98 = 0x1e;
  uStack_90 = 0x1d5a614;
  matcher_00._M_str = extraout_RDX;
  matcher_00._M_len = 0x1d5a614;
  local_88 = (basic_string_view<char,_std::char_traits<char>_>)
             testing::Contains<std::basic_string_view<char,std::char_traits<char>>>
                       ((testing *)0x1e,matcher_00);
  m.inner_matcher_._M_str = local_88._M_str;
  m.inner_matcher_._M_len = (size_t)m.inner_matcher_._M_str;
  local_78 = (basic_string_view<char,_std::char_traits<char>_>)
             testing::
             Not<testing::internal::ContainsMatcher<std::basic_string_view<char,std::char_traits<char>>>>
                       ((testing *)local_88._M_len,m);
  matcher_01.matcher_.inner_matcher_._M_str = local_78._M_str;
  matcher_01.matcher_.inner_matcher_._M_len = (size_t)matcher_01.matcher_.inner_matcher_._M_str;
  local_68 = (basic_string_view<char,_std::char_traits<char>_>)
             testing::internal::
             MakePredicateFormatterFromMatcher<testing::internal::NotMatcher<testing::internal::ContainsMatcher<std::basic_string_view<char,std::char_traits<char>>>>>
                       ((internal *)local_78._M_len,matcher_01);
  puVar3 = local_30;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::NotMatcher<testing::internal::ContainsMatcher<std::basic_string_view<char,std::char_traits<char>>>>>
  ::operator()(local_58,(char *)&local_68,
               (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)0x1f35024);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    puVar3 = (undefined1 *)0x67;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_visitor_test.cc"
               ,0x67,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  local_118 = "proto2_unittest.optional_nested_message_extension";
  local_128 = "proto2_unittest.TestAllTypes.oneof_nested_message";
  pcStack_120 = "proto2_unittest.TestAllTypes.oneof_field";
  local_138 = "proto2_unittest.SPARSE_C";
  pcStack_130 = "proto2_unittest.TestAllTypes.optional_int32";
  local_148 = "proto2_unittest.TestAllTypes";
  pcStack_140 = "proto2_unittest.TestSparseEnum";
  local_108 = (testing *)&local_148;
  local_100 = 7;
  xs._M_len = (size_type)puVar3;
  xs._M_array = (iterator)0x7;
  testing::IsSupersetOf<char_const*>(&local_f8,local_108,xs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<char_const*>>
            (&local_d8,(internal *)&local_f8,matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<char_const*>>::
  operator()(local_b8,(char *)&local_d8,
             (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)0x1f35024);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<const_char_*>_>
  ::~PredicateFormatterFromMatcher(&local_d8);
  testing::internal::UnorderedElementsAreArrayMatcher<const_char_*>::
  ~UnorderedElementsAreArrayMatcher(&local_f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_visitor_test.cc"
               ,0x6f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_158,&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *)local_30);
  return;
}

Assistant:

TEST(VisitDescriptorsTest, AllTypesDeduceSelective) {
  const FileDescriptor& file =
      *proto2_unittest::TestAllTypes::GetDescriptor()->file();
  std::vector<absl::string_view> descriptors;
  VisitDescriptors(
      file,
      // Only select on descriptors with a full_name method.
      [&](const auto& descriptor)
          -> std::enable_if_t<
              !std::is_void<decltype(descriptor.full_name())>::value> {
        descriptors.push_back(descriptor.full_name());
      });
  // FileDescriptor doesn't have a full_name method.
  EXPECT_THAT(descriptors, Not(Contains(kUnittestProtoFile)));
  EXPECT_THAT(descriptors,
              IsSupersetOf(
                  {"proto2_unittest.TestAllTypes",
                   "proto2_unittest.TestSparseEnum", "proto2_unittest.SPARSE_C",
                   "proto2_unittest.TestAllTypes.optional_int32",
                   "proto2_unittest.TestAllTypes.oneof_nested_message",
                   "proto2_unittest.TestAllTypes.oneof_field",
                   "proto2_unittest.optional_nested_message_extension"}));
}